

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

void __thiscall
nv::FloatImage::exponentiate(FloatImage *this,uint base_component,uint num,float power)

{
  ushort uVar1;
  ushort uVar2;
  float *pfVar3;
  long lVar4;
  uint c;
  uint uVar5;
  uint uVar6;
  float fVar7;
  
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  for (uVar5 = 0; uVar5 != num; uVar5 = uVar5 + 1) {
    uVar6 = this->m_width * base_component * (uint)this->m_height;
    pfVar3 = this->m_mem;
    for (lVar4 = 0; (ulong)uVar2 * (ulong)uVar1 - lVar4 != 0; lVar4 = lVar4 + 1) {
      fVar7 = powf(pfVar3[(ulong)uVar6 + lVar4],power);
      pfVar3[(ulong)uVar6 + lVar4] = fVar7;
    }
    base_component = base_component + 1;
  }
  return;
}

Assistant:

void FloatImage::exponentiate(uint base_component, uint num, float power)
{
	const uint size = m_width * m_height;

	for(uint c = 0; c < num; c++) {
		float * ptr = this->channel(base_component + c);
		
		for(uint i = 0; i < size; i++) {
			ptr[i] = pow(ptr[i], power);
		}
	}
}